

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

void __thiscall Search::Search(Search *this,ifstream *ifs,Point *maze_entry,Point *maze_target)

{
  Point *maze_target_local;
  Point *maze_entry_local;
  ifstream *ifs_local;
  Search *this_local;
  
  this->_vptr_Search = (_func_int **)&PTR___cxa_pure_virtual_00110c70;
  this->num_nodes = 0;
  std::shared_ptr<Node>::shared_ptr(&this->final);
  Maze::Maze(&this->maze,ifs);
  this->entry = *maze_entry;
  this->target = *maze_target;
  std::vector<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>::vector
            (&this->visited);
  std::
  unordered_set<std::pair<int,_int>,_PointHash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::unordered_set(&this->visited_points);
  return;
}

Assistant:

Search::Search(ifstream &ifs, const Point &maze_entry, const Point &maze_target) : maze(ifs), entry(maze_entry),
                                                                                   target(maze_target), num_nodes(0) {}